

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageFederateManager::getMessage(MessageFederateManager *this,Endpoint *ept)

{
  optional<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_> message;
  undefined8 local_20;
  undefined1 local_18;
  
  if (ept->dataReference != (void *)0x0) {
    gmlc::containers::
    SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
    ::pop((SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
           *)&stack0xffffffffffffffe0);
    if (local_18 == '\x01') {
      (this->mLocalEndpoints).m_obj.dataStorage.csize = local_20;
      local_20 = 0;
      std::
      _Optional_payload_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
      ::_M_reset((_Optional_payload_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
                  *)&stack0xffffffffffffffe0);
      return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             this;
    }
    std::
    _Optional_payload_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
    ::_M_reset((_Optional_payload_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>
                *)&stack0xffffffffffffffe0);
  }
  (this->mLocalEndpoints).m_obj.dataStorage.csize = 0;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> MessageFederateManager::getMessage(const Endpoint& ept)
{
    if (ept.dataReference != nullptr) {
        auto* eptDat = reinterpret_cast<EndpointData*>(ept.dataReference);
        auto message = eptDat->messages.pop();
        if (message) {
            return std::move(*message);
        }
    }
    return nullptr;
}